

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

void AI::setupPredicates(TaskDatabase *tasks)

{
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *pvVar1;
  anon_class_1_0_00000001 local_d9;
  undefined1 local_d8 [47];
  anon_class_1_0_00000001 local_a9;
  undefined1 local_a8 [47];
  anon_class_1_0_00000001 local_79;
  undefined1 local_78 [63];
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [40];
  TaskDatabase *local_10;
  TaskDatabase *tasks_local;
  
  local_38._0_4_ = NearPlayer;
  local_10 = tasks;
  std::function<bool(AI::WorldState_const&,AI::Task_const&,int)>::
  function<AI::setupPredicates(AI::TaskDatabase&)::__0,void>
            ((function<bool(AI::WorldState_const&,AI::Task_const&,int)> *)(local_38 + 8),&local_39);
  std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>::push_back
            (&tasks->satisfiablePredicates,(value_type *)local_38);
  SatisfiablePredicate::~SatisfiablePredicate((SatisfiablePredicate *)local_38);
  pvVar1 = &local_10->satisfiablePredicates;
  local_78._0_4_ = NearDestination;
  std::function<bool(AI::WorldState_const&,AI::Task_const&,int)>::
  function<AI::setupPredicates(AI::TaskDatabase&)::__1,void>
            ((function<bool(AI::WorldState_const&,AI::Task_const&,int)> *)(local_78 + 8),&local_79);
  std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>::push_back
            (pvVar1,(value_type *)local_78);
  SatisfiablePredicate::~SatisfiablePredicate((SatisfiablePredicate *)local_78);
  pvVar1 = &local_10->satisfiablePredicates;
  local_a8._0_4_ = TimeElapsed;
  std::function<bool(AI::WorldState_const&,AI::Task_const&,int)>::
  function<AI::setupPredicates(AI::TaskDatabase&)::__2,void>
            ((function<bool(AI::WorldState_const&,AI::Task_const&,int)> *)(local_a8 + 8),&local_a9);
  std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>::push_back
            (pvVar1,(value_type *)local_a8);
  SatisfiablePredicate::~SatisfiablePredicate((SatisfiablePredicate *)local_a8);
  pvVar1 = &local_10->satisfiablePredicates;
  local_d8._0_4_ = ParameterFlag;
  std::function<bool(AI::WorldState_const&,AI::Task_const&,int)>::
  function<AI::setupPredicates(AI::TaskDatabase&)::__3,void>
            ((function<bool(AI::WorldState_const&,AI::Task_const&,int)> *)(local_d8 + 8),&local_d9);
  std::vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>::push_back
            (pvVar1,(value_type *)local_d8);
  SatisfiablePredicate::~SatisfiablePredicate((SatisfiablePredicate *)local_d8);
  return;
}

Assistant:

void setupPredicates(TaskDatabase& tasks)
	{
		//const int numberOfPredicates = 4;
		//tasks.satisfiablePredicates.reserve(numberOfPredicates);

		tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& currentPosition = state.current.vectors.at(WorldStateIdentifier::CurrentPosition);
			auto& destination = state.current.vectors.at(WorldStateIdentifier::PlayerPosition);

			return distanceSquared(currentPosition, destination) < 100000.f;
		}});

		tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::NearDestination,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& currentPosition = state.current.vectors.at(WorldStateIdentifier::CurrentPosition_Feet);
			auto& destination = state.current.vectors.at(WorldStateIdentifier::Destination);

			float minimumDistance = 50000.f;

			if (parameterIndex != -1)
			{
				minimumDistance = task.parameters.vectors[parameterIndex].x;
			}
			
			return distanceSquared(currentPosition, destination) < minimumDistance;
		}});

		/*tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::NearActor,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& currentPosition = state.current.vectors.at(WorldStateIdentifier::CurrentPosition_Feet);

			auto& parameters = task.parameters.vectors[parameterIndex];
			EBlackboardKey blackboardKey {static_cast<EBlackboardKey>(FMath::RoundToInt(parameters.x))};
			auto destination = Cast<Actor>(state.blackboard->GetValueAsObject({*UEnum::GetValueAsString(TEXT("/Script/WoodenSphere.EBlackboardKey"), blackboardKey)}))->GetActorLocation();

			float minimumDistance = 50000.f;

			if (parameterIndex != -1)
			{
				minimumDistance = task.parameters.vectors[parameterIndex].y;
			}
			
			return distanceSquared(currentPosition, destination) < minimumDistance;
		}});*/

		tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::TimeElapsed,			
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& parameters = task.parameters.vectors[parameterIndex];
			return parameters.x >= parameters.y;
		}});

		tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::ParameterFlag,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& parameters = task.parameters.vectors[parameterIndex];
			return parameters.x != 0;
		}});

		/*tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::Blackboard_ValueNotNull,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& parameters = task.parameters.vectors[parameterIndex];
			EBlackboardKey blackboardKey {static_cast<EBlackboardKey>(FMath::RoundToInt(parameters.x))};
			return state.blackboard->GetValueAsObject({*UEnum::GetValueAsString(TEXT("/Script/WoodenSphere.EBlackboardKey"), blackboardKey)}) != nullptr;
		}});*/

		/*tasks.satisfiablePredicates.push_back({SatisfiablePredicateIdentifier::ReactionFinished,
			[](const WorldState& state, const Task& task, int parameterIndex)
		{
			auto& parameters = task.parameters.vectors[parameterIndex];
			return state.animationDriver->reactionDriver->tracker->getRequestId() == FMath::RoundToInt(parameters.x)
				&& state.animationDriver->reactionDriver->tracker->reactionHasFinished();
		}});*/

	}